

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastDivider(Gia_Man_t *pNew,int *pNum,int nNum,int *pDiv,int nDiv,int fQuo,Vec_Int_t *vRes
                     )

{
  int iVar1;
  int iVar2;
  int iData1;
  int iData0;
  int *piVar3;
  int *pArray;
  int *pArray_00;
  int local_a4;
  int local_64;
  int top_bit;
  int y_bit;
  int borrow;
  int known;
  int j;
  int i;
  int *pTemp;
  int *pQuo;
  int *pRes;
  int fQuo_local;
  int nDiv_local;
  int *pDiv_local;
  int nNum_local;
  int *pNum_local;
  Gia_Man_t *pNew_local;
  
  piVar3 = Wlc_VecCopy(vRes,pNum,nNum);
  pArray = (int *)malloc((long)nNum << 2);
  pArray_00 = (int *)malloc((long)nNum << 2);
  if (nNum == nDiv) {
    for (borrow = nNum + -1; -1 < borrow; borrow = borrow + -1) {
      y_bit = 0;
      known = nNum + -1;
      while (((nNum + -1) - borrow < known &&
             (y_bit = Gia_ManHashOr(pNew,y_bit,pDiv[known]), y_bit != 1))) {
        known = known + -1;
      }
      pArray[borrow] = y_bit;
      known = nNum + -1;
      while ((-1 < known && (y_bit != 1))) {
        if (known < borrow) {
          local_64 = 0;
        }
        else {
          local_64 = pDiv[known - borrow];
        }
        iVar2 = pArray[borrow];
        iVar1 = Abc_LitNot(piVar3[known]);
        iVar1 = Gia_ManHashAnd(pNew,local_64,iVar1);
        iVar2 = Gia_ManHashMux(pNew,y_bit,iVar2,iVar1);
        pArray[borrow] = iVar2;
        iVar2 = Gia_ManHashXor(pNew,local_64,piVar3[known]);
        y_bit = Gia_ManHashOr(pNew,y_bit,iVar2);
        known = known + -1;
      }
      iVar2 = Abc_LitNot(pArray[borrow]);
      pArray[borrow] = iVar2;
      if (pArray[borrow] != 0) {
        top_bit = 0;
        for (known = 0; known < nNum; known = known + 1) {
          iVar2 = Abc_LitNot(piVar3[known]);
          iVar2 = Gia_ManHashMux(pNew,top_bit,iVar2,piVar3[known]);
          if (known < borrow) {
            local_a4 = 0;
          }
          else {
            local_a4 = pDiv[known - borrow];
          }
          iVar1 = piVar3[known];
          iData1 = Gia_ManHashAnd(pNew,top_bit,local_a4);
          iData0 = Gia_ManHashOr(pNew,top_bit,local_a4);
          top_bit = Gia_ManHashMux(pNew,iVar1,iData1,iData0);
          iVar2 = Gia_ManHashXor(pNew,iVar2,local_a4);
          pArray_00[known] = iVar2;
        }
        if (pArray[borrow] == 1) {
          Wlc_VecCopy(vRes,pArray_00,nNum);
        }
        else {
          for (known = 0; known < nNum; known = known + 1) {
            iVar2 = Gia_ManHashMux(pNew,pArray[borrow],pArray_00[known],piVar3[known]);
            piVar3[known] = iVar2;
          }
        }
      }
    }
    if (pArray_00 != (int *)0x0) {
      free(pArray_00);
    }
    if (fQuo != 0) {
      Wlc_VecCopy(vRes,pArray,nNum);
    }
    if (pArray != (int *)0x0) {
      free(pArray);
    }
    return;
  }
  __assert_fail("nNum == nDiv",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcBlast.c"
                ,0x247,
                "void Wlc_BlastDivider(Gia_Man_t *, int *, int, int *, int, int, Vec_Int_t *)");
}

Assistant:

void Wlc_BlastDivider( Gia_Man_t * pNew, int * pNum, int nNum, int * pDiv, int nDiv, int fQuo, Vec_Int_t * vRes )
{
    int * pRes  = Wlc_VecCopy( vRes, pNum, nNum );
    int * pQuo  = ABC_ALLOC( int, nNum );
    int * pTemp = ABC_ALLOC( int, nNum );
    int i, j, known, borrow, y_bit, top_bit;
    assert( nNum == nDiv );
    for ( j = nNum - 1; j >= 0; j-- ) 
    {
        known = 0;
        for ( i = nNum - 1; i > nNum - 1 - j; i-- ) 
        {
            known = Gia_ManHashOr( pNew, known, pDiv[i] );
            if( known == 1 ) 
                break;
        }
        pQuo[j] = known;
        for ( i = nNum - 1; i >= 0; i-- ) 
        {
            if ( known == 1 ) 
                break;
            y_bit = (i >= j) ? pDiv[i-j] : 0;
            pQuo[j] = Gia_ManHashMux( pNew, known, pQuo[j], Gia_ManHashAnd( pNew, y_bit, Abc_LitNot(pRes[i]) ) );
            known = Gia_ManHashOr( pNew, known, Gia_ManHashXor(pNew, y_bit, pRes[i]));
        }
        pQuo[j] = Abc_LitNot(pQuo[j]);
        if ( pQuo[j] == 0 )
            continue;
        borrow = 0;
        for ( i = 0; i < nNum; i++ ) 
        {
            top_bit  = Gia_ManHashMux( pNew, borrow, Abc_LitNot(pRes[i]), pRes[i] );
            y_bit    = (i >= j) ? pDiv[i-j] : 0;
            borrow   = Gia_ManHashMux( pNew, pRes[i], Gia_ManHashAnd(pNew, borrow, y_bit), Gia_ManHashOr(pNew, borrow, y_bit) );
            pTemp[i] = Gia_ManHashXor( pNew, top_bit, y_bit );
        }
        if ( pQuo[j] == 1 ) 
            Wlc_VecCopy( vRes, pTemp, nNum );
        else 
            for( i = 0; i < nNum; i++ ) 
                pRes[i] = Gia_ManHashMux( pNew, pQuo[j], pTemp[i], pRes[i] );
    }
    ABC_FREE( pTemp );
    if ( fQuo )
        Wlc_VecCopy( vRes, pQuo, nNum );
    ABC_FREE( pQuo );
}